

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O3

_Bool hasAttribute(xmlNodePtr node,xmlChar *name)

{
  int iVar1;
  _xmlAttr *p_Var2;
  _Bool _Var3;
  
  p_Var2 = node->properties;
  if (p_Var2 == (_xmlAttr *)0x0) {
    _Var3 = false;
  }
  else {
    do {
      iVar1 = xmlStrEqual(p_Var2->name,"time");
      _Var3 = iVar1 != 0;
      if (_Var3) {
        return _Var3;
      }
      p_Var2 = p_Var2->next;
    } while (p_Var2 != (_xmlAttr *)0x0);
  }
  return _Var3;
}

Assistant:

static bool hasAttribute(xmlNodePtr node, const xmlChar* name) {
    xmlAttr *attr = node->properties;
    while (attr) {
        if (xmlStrEqual(attr->name, name)) {
            return true;
        }
        attr = attr->next;
    }

    return false;
}